

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

uchar mbedtls_ssl_sig_from_pk(mbedtls_pk_context *pk)

{
  uchar uVar1;
  int iVar2;
  
  iVar2 = mbedtls_pk_can_do(pk,MBEDTLS_PK_RSA);
  uVar1 = '\x01';
  if (iVar2 == 0) {
    iVar2 = mbedtls_pk_can_do(pk,MBEDTLS_PK_ECDSA);
    uVar1 = (iVar2 != 0) * '\x03';
  }
  return uVar1;
}

Assistant:

unsigned char mbedtls_ssl_sig_from_pk( mbedtls_pk_context *pk )
{
#if defined(MBEDTLS_RSA_C)
    if( mbedtls_pk_can_do( pk, MBEDTLS_PK_RSA ) )
        return( MBEDTLS_SSL_SIG_RSA );
#endif
#if defined(MBEDTLS_ECDSA_C)
    if( mbedtls_pk_can_do( pk, MBEDTLS_PK_ECDSA ) )
        return( MBEDTLS_SSL_SIG_ECDSA );
#endif
    return( MBEDTLS_SSL_SIG_ANON );
}